

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O0

bool __thiscall Tree::check(Tree *this,Node *me,Node *you)

{
  bool bVar1;
  bool local_29;
  bool b;
  Node *you_local;
  Node *me_local;
  Tree *this_local;
  
  if (me->data == you->data) {
    local_29 = true;
    if ((me->left != (Node *)0x0) || (you->left != (Node *)0x0)) {
      local_29 = check(this,me->left,you->left);
    }
    if ((me->right != (Node *)0x0) || (you->right != (Node *)0x0)) {
      bVar1 = check(this,me->right,you->right);
      local_29 = (local_29 & bVar1) != 0;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check(Node *me, Node *you) {
        if (me->data != you->data) {
            return false;
        } else {
            bool b = true;
            if (me->left != nullptr || you->left != nullptr)
                b = b & check(me->left, you->left);
            if (me->right != nullptr || you->right != nullptr)
                b = b & check(me->right, you->right);
            return b;
        }
    }